

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUnitTest++.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_522a9::TestCheckThrowMacroFailsOnWrongException::
~TestCheckThrowMacroFailsOnWrongException(TestCheckThrowMacroFailsOnWrongException *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckThrowMacroFailsOnWrongException)
{
    class WrongThrowTest : public UnitTest::Test
    {
    public:
        WrongThrowTest() : Test("wrongthrow") {}
        virtual void RunImpl() const
        {
            CHECK_THROW(throw "oops", int);
        }
    };

    UnitTest::TestResults results;
	{
		ScopedCurrentTest scopedResults(results);

		WrongThrowTest test;
		test.Run();
	}

	CHECK_EQUAL(1, results.GetFailureCount());
}